

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O1

void tommy_hashdyn_insert
               (tommy_hashdyn *hashdyn,tommy_hashdyn_node *node,void *data,tommy_hash_t hash)

{
  long lVar1;
  tommy_hashdyn_node *ptVar2;
  uint uVar3;
  tommy_node_struct *ptVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = hashdyn->bucket_mask & hash;
  ptVar2 = hashdyn->bucket[uVar3];
  if (ptVar2 == (tommy_hashdyn_node *)0x0) {
    ptVar4 = (tommy_node_struct *)(hashdyn->bucket + uVar3);
    node->prev = node;
    node->next = (tommy_node_struct *)0x0;
  }
  else {
    node->prev = ptVar2->prev;
    ptVar2->prev = node;
    node->next = (tommy_node_struct *)0x0;
    ptVar4 = node->prev;
  }
  ptVar4->next = node;
  node->data = data;
  node->key = hash;
  uVar3 = hashdyn->count + 1;
  hashdyn->count = uVar3;
  if (uVar3 < hashdyn->bucket_max >> 1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    tommy_hashdyn_resize(hashdyn,hashdyn->bucket_bit + 1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashdyn_insert(tommy_hashdyn* hashdyn, tommy_hashdyn_node* node, void* data, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashdyn->bucket_mask;

	tommy_list_insert_tail(&hashdyn->bucket[pos], node, data);

	node->key = hash;

	++hashdyn->count;

	hashdyn_grow_step(hashdyn);
}